

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O2

SetInfluences * __thiscall wasm::LocalGraph::getSetInfluences(LocalGraph *this,LocalSet *set)

{
  int iVar1;
  const_iterator cVar2;
  SetInfluences *pSVar3;
  LocalSet *local_18;
  LocalSet *set_local;
  
  local_18 = set;
  cVar2 = std::
          _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->setInfluences)._M_h,&local_18);
  if (cVar2.
      super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pSVar3 = &getSetInfluences::empty;
    if (getSetInfluences(wasm::LocalSet*)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&getSetInfluences(wasm::LocalSet*)::empty);
      if (iVar1 != 0) {
        pSVar3 = &getSetInfluences::empty;
        getSetInfluences::empty._M_h._M_buckets = &getSetInfluences::empty._M_h._M_single_bucket;
        getSetInfluences::empty._M_h._M_bucket_count = 1;
        getSetInfluences::empty._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        getSetInfluences::empty._M_h._M_element_count = 0;
        getSetInfluences::empty._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        getSetInfluences::empty._M_h._M_rehash_policy._M_next_resize = 0;
        getSetInfluences::empty._M_h._M_single_bucket = (__node_base_ptr)0x0;
        __cxa_atexit(std::
                     unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                     ::~unordered_set,&getSetInfluences::empty,&__dso_handle);
        __cxa_guard_release(&getSetInfluences(wasm::LocalSet*)::empty);
      }
    }
  }
  else {
    pSVar3 = (SetInfluences *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                    ._M_cur + 0x10);
  }
  return pSVar3;
}

Assistant:

const SetInfluences& getSetInfluences(LocalSet* set) const {
    auto iter = setInfluences.find(set);
    if (iter == setInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const SetInfluences empty;
      return empty;
    }
    return iter->second;
  }